

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

string * showClause_abi_cxx11_(string *__return_storage_ptr__,Clause *c)

{
  ulong uVar1;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0xff < *(uint *)c) {
    uVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      if (*(uint *)c >> 8 <= uVar1) {
        abort();
      }
      getLitString_abi_cxx11_(&local_1d8,c->data[uVar1].x);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(uint *)c >> 8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string showClause(Clause& c) {
	std::stringstream ss;
	for (unsigned int i = 0; i < c.size(); i++) {
		ss << " " << getLitString(toInt(c[i]));
	}
	return ss.str();
}